

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O0

void Eigen::internal::treePostorder<int,Eigen::Matrix<int,_1,1,0,_1,1>>
               (int n,Matrix<int,__1,_1,_0,__1,_1> *parent,Matrix<int,__1,_1,_0,__1,_1> *post)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  Scalar local_5c;
  int local_58;
  int local_54;
  int dad;
  int v;
  int postnum;
  undefined1 local_40 [8];
  Matrix<int,__1,_1,_0,__1,_1> next_kid;
  Matrix<int,__1,_1,_0,__1,_1> first_kid;
  Matrix<int,__1,_1,_0,__1,_1> *post_local;
  Matrix<int,__1,_1,_0,__1,_1> *parent_local;
  int n_local;
  
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<int,__1,_1,_0,__1,_1> *)
             &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_40);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
             &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (long)(n + 1));
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_40,(long)(n + 1));
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            (&post->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)(n + 1));
  local_5c = -1;
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
             &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &local_5c);
  for (local_54 = n + -1; -1 < local_54; local_54 = local_54 + -1) {
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)parent,
                        (long)local_54);
    local_58 = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                        &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,(long)local_58);
    SVar1 = *pSVar3;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_40,
                        (long)local_54);
    iVar2 = local_54;
    *pSVar3 = SVar1;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                        &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,(long)local_58);
    *pSVar3 = iVar2;
  }
  dad = 0;
  nr_etdfs<int,Eigen::Matrix<int,_1,1,0,_1,1>>
            (n,parent,(Matrix<int,__1,_1,_0,__1,_1> *)
                      &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows,(Matrix<int,__1,_1,_0,__1,_1> *)local_40,post,0);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_40);
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<int,__1,_1,_0,__1,_1> *)
             &next_kid.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  return;
}

Assistant:

void treePostorder(Index n, IndexVector& parent, IndexVector& post)
{
  IndexVector first_kid, next_kid; // Linked list of children 
  Index postnum; 
  // Allocate storage for working arrays and results 
  first_kid.resize(n+1); 
  next_kid.setZero(n+1);
  post.setZero(n+1);
  
  // Set up structure describing children
  Index v, dad; 
  first_kid.setConstant(-1); 
  for (v = n-1; v >= 0; v--) 
  {
    dad = parent(v);
    next_kid(v) = first_kid(dad); 
    first_kid(dad) = v; 
  }
  
  // Depth-first search from dummy root vertex #n
  postnum = 0; 
  internal::nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
}